

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus AddThumbPredicate(cs_struct *ud,MCInst *MI)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  DecodeStatus extraout_EAX;
  MCOperand *pMVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  MCOperandInfo *m;
  
  uVar2 = MCInst_getOpcode(MI);
  uVar6 = 0xe;
  if ((((uVar2 - 0xa98 < 0x35) && ((0x1000100000010dU >> ((ulong)(uVar2 - 0xa98) & 0x3f) & 1) != 0))
      || (uVar2 - 0x90f < 3)) ||
     (((0x3b < uVar2 - 0xa51 || ((0x800000000000005U >> ((ulong)(uVar2 - 0xa51) & 0x3f) & 1) == 0))
      && ((uVar2 != 0x8fc && (uVar2 == 0x904)))))) {
    uVar2 = (ud->ITBlock).size;
    if (uVar2 == 0) {
      return MCDisassembler_Fail;
    }
  }
  else {
    uVar2 = (ud->ITBlock).size;
    if (uVar2 == 0) goto LAB_0014875b;
  }
  bVar5 = (ud->ITBlock).ITStates[uVar2 - 1];
  if (bVar5 == 0xf) {
    bVar5 = 0xe;
  }
  uVar6 = (uint)bVar5;
  (ud->ITBlock).size = uVar2 - 1;
LAB_0014875b:
  uVar2 = MCInst_getOpcode(MI);
  m = ARMInsts[uVar2].OpInfo;
  uVar2 = MCInst_getOpcode(MI);
  bVar5 = ARMInsts[uVar2].NumOperands;
  uVar2 = (uint)bVar5;
  uVar7 = 0;
  do {
    if (bVar5 == uVar7) {
LAB_001487b8:
      pMVar4 = MCOperand_CreateImm1(MI,(ulong)uVar6);
      MCInst_insert0(MI,uVar2,pMVar4);
      pMVar4 = MCOperand_CreateReg1(MI,(uint)(uVar6 != 0xe) * 3);
      MCInst_insert0(MI,uVar2 + 1,pMVar4);
      return extraout_EAX;
    }
    uVar3 = MCInst_getNumOperands(MI);
    if ((uVar7 == uVar3) || (_Var1 = MCOperandInfo_isPredicate(m), _Var1)) {
      uVar2 = (uint)uVar7;
      goto LAB_001487b8;
    }
    uVar7 = uVar7 + 1;
    m = m + 1;
  } while( true );
}

Assistant:

static DecodeStatus AddThumbPredicate(cs_struct *ud, MCInst *MI)
{
	DecodeStatus S = MCDisassembler_Success;
	MCOperandInfo *OpInfo;
	unsigned short NumOps;
	unsigned int i;
	unsigned CC;

	// A few instructions actually have predicates encoded in them.  Don't
	// try to overwrite it if we're seeing one of those.
	switch (MCInst_getOpcode(MI)) {
		case ARM_tBcc:
		case ARM_t2Bcc:
		case ARM_tCBZ:
		case ARM_tCBNZ:
		case ARM_tCPS:
		case ARM_t2CPS3p:
		case ARM_t2CPS2p:
		case ARM_t2CPS1p:
		case ARM_tMOVSr:
		case ARM_tSETEND:
			// Some instructions (mostly conditional branches) are not
			// allowed in IT blocks.
			if (ITStatus_instrInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			else
				return MCDisassembler_Success;
			break;
		case ARM_tB:
		case ARM_t2B:
		case ARM_t2TBB:
		case ARM_t2TBH:
			// Some instructions (mostly unconditional branches) can
			// only appears at the end of, or outside of, an IT.
			//if (ITBlock.instrInITBlock() && !ITBlock.instrLastInITBlock())
			if (ITStatus_instrInITBlock(&(ud->ITBlock)) && !ITStatus_instrLastInITBlock(&(ud->ITBlock)))
				S = MCDisassembler_SoftFail;
			break;
		default:
			break;
	}

	// If we're in an IT block, base the predicate on that.  Otherwise,
	// assume a predicate of AL.
	CC = ITStatus_getITCC(&(ud->ITBlock));
	if (CC == 0xF) 
		CC = ARMCC_AL;
	if (ITStatus_instrInITBlock(&(ud->ITBlock)))
		ITStatus_advanceITState(&(ud->ITBlock));

	OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;

	for (i = 0; i < NumOps; ++i) {
		if (i == MCInst_getNumOperands(MI)) break;
		if (MCOperandInfo_isPredicate(&OpInfo[i])) {
			MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
			if (CC == ARMCC_AL)
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
			else
				MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));
			return S;
		}
	}

	MCInst_insert0(MI, i, MCOperand_CreateImm1(MI, CC));
	if (CC == ARMCC_AL)
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, 0));
	else
		MCInst_insert0(MI, i+1, MCOperand_CreateReg1(MI, ARM_CPSR));

	return S;
}